

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_ktx_texture.h
# Opt level: O2

void __thiscall crnlib::ktx_texture::clear(ktx_texture *this)

{
  (this->m_header).m_numberOfArrayElements = 0;
  (this->m_header).m_numberOfFaces = 0;
  (this->m_header).m_numberOfMipmapLevels = 0;
  (this->m_header).m_bytesOfKeyValueData = 0;
  (this->m_header).m_glBaseInternalFormat = 0;
  (this->m_header).m_pixelWidth = 0;
  (this->m_header).m_pixelHeight = 0;
  (this->m_header).m_pixelDepth = 0;
  (this->m_header).m_glType = 0;
  (this->m_header).m_glTypeSize = 0;
  (this->m_header).m_glFormat = 0;
  (this->m_header).m_glInternalFormat = 0;
  (this->m_header).m_identifier[0] = '\0';
  (this->m_header).m_identifier[1] = '\0';
  (this->m_header).m_identifier[2] = '\0';
  (this->m_header).m_identifier[3] = '\0';
  (this->m_header).m_identifier[4] = '\0';
  (this->m_header).m_identifier[5] = '\0';
  (this->m_header).m_identifier[6] = '\0';
  (this->m_header).m_identifier[7] = '\0';
  *(undefined8 *)((this->m_header).m_identifier + 8) = 0;
  vector<crnlib::vector<unsigned_char>_>::clear(&this->m_key_values);
  vector<crnlib::vector<unsigned_char>_>::clear(&this->m_image_data);
  this->m_opposite_endianness = false;
  this->m_block_dim = 0;
  this->m_bytes_per_block = 0;
  return;
}

Assistant:

void clear()
        {
            m_header.clear();
            m_key_values.clear();
            m_image_data.clear();

            m_block_dim = 0;
            m_bytes_per_block = 0;

            m_opposite_endianness = false;
        }